

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O3

int ExtractMetadataFromPNG
              (png_structp png,png_infop head_info,png_infop end_info,Metadata *metadata)

{
  char *__s1;
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined8 unaff_RBP;
  undefined8 uVar6;
  png_infop ppVar7;
  anon_struct_24_3_f6017608 *paVar8;
  int *piVar9;
  png_textp text;
  png_uint_32 len;
  png_uint_32 len_1;
  png_bytep exif;
  int comp_type;
  int *local_88;
  uint local_80;
  undefined4 uStack_7c;
  uint local_78;
  uint local_74;
  Metadata *local_70;
  char *local_68;
  MetadataPayload *local_60;
  png_structp local_58;
  png_infop local_50;
  png_infop local_48;
  png_infop local_40;
  undefined1 local_34 [4];
  
  local_60 = &metadata->iccp;
  uVar6 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  local_70 = metadata;
  local_58 = png;
  local_50 = head_info;
  local_48 = end_info;
  do {
    ppVar7 = local_48;
    if ((char)uVar6 != '\0') {
      ppVar7 = local_50;
    }
    local_88 = (int *)0x0;
    iVar2 = png_get_text(png,ppVar7,&local_88,0);
    local_40 = ppVar7;
    iVar3 = png_get_eXIf_1(png,ppVar7,&local_80);
    if ((iVar3 == 0x10000) &&
       (iVar3 = MetadataCopy(local_68,(ulong)local_80,&local_70->exif), iVar3 == 0)) {
      return 0;
    }
    local_78 = (uint)uVar6;
    if (iVar2 != 0) {
      iVar3 = 0;
      do {
        piVar9 = local_88;
        __s1 = *(char **)(local_88 + 2);
        iVar4 = strcmp(__s1,"Raw profile type exif");
        paVar8 = kPNGMetadataMap;
        if (iVar4 != 0) {
          lVar1 = 0;
          do {
            lVar5 = lVar1;
            if (lVar5 + 0x18 == 0x78) goto LAB_001080b1;
            iVar4 = strcmp(__s1,*(char **)((long)&kPNGMetadataMap[1].name + lVar5));
            lVar1 = lVar5 + 0x18;
          } while (iVar4 != 0);
          paVar8 = (anon_struct_24_3_f6017608 *)(lVar5 + 0x1f9b98);
        }
        if (*(long *)((long)&(local_70->exif).bytes + paVar8->storage_offset) == 0) {
          iVar4 = (*paVar8->process)(*(char **)(piVar9 + 4),
                                     *(size_t *)(piVar9 + (ulong)(*piVar9 - 1U < 2) * 2 + 6),
                                     (MetadataPayload *)
                                     ((long)&(local_70->exif).bytes + paVar8->storage_offset));
          piVar9 = local_88;
          if (iVar4 == 0) {
            ExtractMetadataFromPNG_cold_1();
            return 0;
          }
        }
        else {
          fprintf(stderr,"Ignoring additional \'%s\'\n",__s1);
          piVar9 = local_88;
        }
LAB_001080b1:
        iVar3 = iVar3 + 1;
        local_88 = piVar9 + 0xe;
      } while (iVar3 != iVar2);
    }
    png = local_58;
    iVar2 = png_get_iCCP(local_58,local_40,&local_68,local_34,&local_80,&local_74);
    if ((iVar2 == 0x1000) &&
       (iVar2 = MetadataCopy((char *)CONCAT44(uStack_7c,local_80),(ulong)local_74,local_60),
       iVar2 == 0)) {
      return 0;
    }
    uVar6 = 0;
    if ((local_78 & 1) == 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int ExtractMetadataFromPNG(png_structp png,
                                  png_infop const head_info,
                                  png_infop const end_info,
                                  Metadata* const metadata) {
  int p;

  for (p = 0; p < 2; ++p)  {
    png_infop const info = (p == 0) ? head_info : end_info;
    png_textp text = NULL;
    const png_uint_32 num = png_get_text(png, info, &text, NULL);
    png_uint_32 i;

#ifdef PNG_eXIf_SUPPORTED
    // Look for an 'eXIf' tag. Preference is given to this tag as it's newer
    // than the TextualData tags.
    {
      png_bytep exif;
      png_uint_32 len;

      if (png_get_eXIf_1(png, info, &len, &exif) == PNG_INFO_eXIf) {
        if (!MetadataCopy((const char*)exif, len, &metadata->exif)) return 0;
      }
    }
#endif  // PNG_eXIf_SUPPORTED

    // Look for EXIF / XMP metadata.
    for (i = 0; i < num; ++i, ++text) {
      int j;
      for (j = 0; kPNGMetadataMap[j].name != NULL; ++j) {
        if (!strcmp(text->key, kPNGMetadataMap[j].name)) {
          MetadataPayload* const payload =
              (MetadataPayload*)((uint8_t*)metadata +
                                 kPNGMetadataMap[j].storage_offset);
          png_size_t text_length;
          switch (text->compression) {
#ifdef PNG_iTXt_SUPPORTED
            case PNG_ITXT_COMPRESSION_NONE:
            case PNG_ITXT_COMPRESSION_zTXt:
              text_length = text->itxt_length;
              break;
#endif
            case PNG_TEXT_COMPRESSION_NONE:
            case PNG_TEXT_COMPRESSION_zTXt:
            default:
              text_length = text->text_length;
              break;
          }
          if (payload->bytes != NULL) {
            fprintf(stderr, "Ignoring additional '%s'\n", text->key);
          } else if (!kPNGMetadataMap[j].process(text->text, text_length,
                                                 payload)) {
            fprintf(stderr, "Failed to process: '%s'\n", text->key);
            return 0;
          }
          break;
        }
      }
    }
#ifdef PNG_iCCP_SUPPORTED
    // Look for an ICC profile.
    {
      png_charp name;
      int comp_type;
#if LOCAL_PNG_PREREQ(1,5)
      png_bytep profile;
#else
      png_charp profile;
#endif
      png_uint_32 len;

      if (png_get_iCCP(png, info,
                       &name, &comp_type, &profile, &len) == PNG_INFO_iCCP) {
        if (!MetadataCopy((const char*)profile, len, &metadata->iccp)) return 0;
      }
    }
#endif  // PNG_iCCP_SUPPORTED
  }
  return 1;
}